

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O2

void __thiscall CodeGenerator::generate(CodeGenerator *this)

{
  _Base_ptr p_Var1;
  ostream *poVar2;
  bool bVar3;
  undefined1 local_58 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
  i;
  
  bVar3 = false;
  for (p_Var1 = (this->m_classes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_classes)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
            *)local_58,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
            *)(p_Var1 + 1));
    if (*(char *)(i.first.field_2._8_8_ + 0xe0) == '\0') {
      bVar3 = true;
      generateClass(this,(Class *)i.first.field_2._8_8_);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  if (!bVar3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "No class definitions present in input. Nothing generated");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void CodeGenerator::generate()
{
    bool atLeastOne = false;
    for (auto i : m_classes) {
        if (!i.second->declarationOnly) {
            atLeastOne = true;
            generateClass(i.second);
        }
    }
    if (!atLeastOne) {
        std::cerr << "No class definitions present in input. Nothing generated" << std::endl;
        return;
    }
}